

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

PackageSymbol * __thiscall
slang::ast::Compilation::createPackage
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  group_type_pointer pgVar5;
  size_t __n;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  ulong uVar9;
  value_type *pvVar10;
  basic_string_view<char,_std::char_traits<char>_> *pbVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  NetType *pNVar16;
  PackageSymbol *pPVar17;
  Diagnostic *this_00;
  uint uVar18;
  group_type_pointer pgVar19;
  value_type_pointer ppVar20;
  pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *ppVar21;
  size_t sVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *ppVar27;
  bool bVar28;
  uchar uVar29;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  SourceRange sourceRange;
  try_emplace_args_t local_e1;
  Compilation *local_e0;
  PackageSymbol *local_d8;
  Scope *local_d0;
  char *local_c8;
  uint64_t local_c0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
  *local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  ulong local_90;
  group_type_pointer local_88;
  ulong local_80;
  value_type *elements_1;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  PackageSymbol *local_68;
  locator res;
  
  arrays_ = &this->syntaxMetadata;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = syntax;
  uVar26 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar15 = uVar26 >> ((byte)(this->syntaxMetadata).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->syntaxMetadata).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
           .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar26 & 0xff];
  ppVar20 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  local_c8 = (char *)(this->syntaxMetadata).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                     .arrays.groups_size_mask;
  uVar25 = 0;
  uVar24 = uVar15;
  do {
    pgVar2 = pgVar5 + uVar24;
    uVar29 = (uchar)uVar4;
    auVar34[0] = -(pgVar2->m[0].n == uVar29);
    uVar31 = (uchar)((uint)uVar4 >> 8);
    auVar34[1] = -(pgVar2->m[1].n == uVar31);
    uVar32 = (uchar)((uint)uVar4 >> 0x10);
    auVar34[2] = -(pgVar2->m[2].n == uVar32);
    uVar33 = (uchar)((uint)uVar4 >> 0x18);
    auVar34[3] = -(pgVar2->m[3].n == uVar33);
    auVar34[4] = -(pgVar2->m[4].n == uVar29);
    auVar34[5] = -(pgVar2->m[5].n == uVar31);
    auVar34[6] = -(pgVar2->m[6].n == uVar32);
    auVar34[7] = -(pgVar2->m[7].n == uVar33);
    auVar34[8] = -(pgVar2->m[8].n == uVar29);
    auVar34[9] = -(pgVar2->m[9].n == uVar31);
    auVar34[10] = -(pgVar2->m[10].n == uVar32);
    auVar34[0xb] = -(pgVar2->m[0xb].n == uVar33);
    auVar34[0xc] = -(pgVar2->m[0xc].n == uVar29);
    auVar34[0xd] = -(pgVar2->m[0xd].n == uVar31);
    auVar34[0xe] = -(pgVar2->m[0xe].n == uVar32);
    auVar34[0xf] = -(pgVar2->m[0xf].n == uVar33);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      uVar6 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar20[uVar24 * 0xf + (ulong)uVar6].first == syntax) {
        ppVar20 = ppVar20 + uVar24 * 0xf + (ulong)uVar6;
        goto LAB_00147a4c;
      }
    }
    if ((pgVar5[uVar24].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar26 & 7]) == 0) {
      ppVar20 = (value_type_pointer)0x0;
      goto LAB_00147a4c;
    }
    lVar23 = uVar24 + uVar25;
    uVar25 = uVar25 + 1;
    uVar24 = lVar23 + 1U & (ulong)local_c8;
  } while (uVar25 <= local_c8);
  ppVar20 = (value_type_pointer)0x0;
LAB_00147a4c:
  local_e0 = this;
  local_d8 = (PackageSymbol *)syntax;
  local_d0 = scope;
  if (ppVar20 == (value_type_pointer)0x0) {
    if ((this->syntaxMetadata).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
        .size_ctrl.size <
        (this->syntaxMetadata).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                       *)arrays_,(arrays_type *)arrays_,uVar15,uVar26,&local_e1,
                 (SyntaxNode **)&local_d8);
      psVar1 = &(this->syntaxMetadata).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar20 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                       *)arrays_,uVar26,&local_e1,(SyntaxNode **)&local_d8);
      ppVar20 = res.p;
    }
  }
  if ((ppVar20->second).defaultNetType == (NetType *)0x0) {
    pNVar16 = Scope::getDefaultNetType(local_d0);
    (ppVar20->second).defaultNetType = pNVar16;
  }
  pPVar17 = PackageSymbol::fromSyntax
                      (local_d0,syntax,(ppVar20->second).defaultNetType,
                       (optional<slang::TimeScale>)
                       ((uint5)*(uint *)&(ppVar20->second).timeScale.
                                         super__Optional_base<slang::TimeScale,_true,_true>.
                                         _M_payload.super__Optional_payload_base<slang::TimeScale>.
                                         _M_engaged << 0x20 |
                       (uint5)(uint)(ppVar20->second).timeScale.
                                    super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                    super__Optional_payload_base<slang::TimeScale>._M_payload));
  local_b8 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
              *)&this->packageMap;
  local_70 = &(pPVar17->super_Symbol).name;
  local_d8 = pPVar17;
  local_c0 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        local_b8,local_70);
  uVar25 = local_c0 >>
           ((byte)(this->packageMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar19 = (this->packageMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
            .arrays.groups_;
  lVar23 = (local_c0 & 0xff) * 4;
  uVar29 = (&UNK_0051605c)[lVar23];
  uVar31 = (&UNK_0051605d)[lVar23];
  uVar32 = (&UNK_0051605e)[lVar23];
  uVar33 = (&UNK_0051605f)[lVar23];
  elements_1 = (this->packageMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
               .arrays.elements_;
  __n = (pPVar17->super_Symbol).name._M_len;
  local_c8 = (pPVar17->super_Symbol).name._M_str;
  uVar24 = (ulong)((uint)local_c0 & 7);
  sVar22 = (this->packageMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
           .arrays.groups_size_mask;
  uVar15 = 0;
  local_80 = uVar25;
  local_68 = pPVar17;
  do {
    pvVar10 = elements_1;
    pgVar3 = pgVar19 + uVar25;
    auVar30[0] = -(pgVar3->m[0].n == uVar29);
    auVar30[1] = -(pgVar3->m[1].n == uVar31);
    auVar30[2] = -(pgVar3->m[2].n == uVar32);
    auVar30[3] = -(pgVar3->m[3].n == uVar33);
    auVar30[4] = -(pgVar3->m[4].n == uVar29);
    auVar30[5] = -(pgVar3->m[5].n == uVar31);
    auVar30[6] = -(pgVar3->m[6].n == uVar32);
    auVar30[7] = -(pgVar3->m[7].n == uVar33);
    auVar30[8] = -(pgVar3->m[8].n == uVar29);
    auVar30[9] = -(pgVar3->m[9].n == uVar31);
    auVar30[10] = -(pgVar3->m[10].n == uVar32);
    auVar30[0xb] = -(pgVar3->m[0xb].n == uVar33);
    auVar30[0xc] = -(pgVar3->m[0xc].n == uVar29);
    auVar30[0xd] = -(pgVar3->m[0xd].n == uVar31);
    auVar30[0xe] = -(pgVar3->m[0xe].n == uVar32);
    auVar30[0xf] = -(pgVar3->m[0xf].n == uVar33);
    lVar12 = uVar25 * 0x10;
    uVar13 = uVar25;
    lVar23 = local_b0;
    uVar26 = local_a8;
    uVar9 = local_a0;
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); local_a8 = uVar15,
        local_a0 = uVar13, local_b0 = lVar12, uVar18 != 0; uVar18 = uVar18 - 1 & uVar18) {
      uVar6 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      bVar28 = __n == pvVar10[uVar25 * 0xf + (ulong)uVar6].first._M_len;
      ppVar27 = (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>
                 *)(pvVar10 + uVar25 * 0xf + (ulong)uVar6);
      local_98 = sVar22;
      local_90 = uVar24;
      local_88 = pgVar19;
      if (bVar28 && __n != 0) {
        iVar14 = bcmp(local_c8,(ppVar27->second).tree,__n);
        bVar28 = iVar14 == 0;
      }
      this = local_e0;
      if (bVar28) goto LAB_00147c6a;
      lVar12 = local_b0;
      pgVar19 = local_88;
      uVar24 = local_90;
      uVar13 = local_a0;
      sVar22 = local_98;
      uVar15 = local_a8;
      lVar23 = local_b0;
      uVar26 = local_a8;
      uVar9 = local_a0;
    }
    if ((((slot_type *)((long)pgVar19 + 0xf))[local_b0].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar24]) == 0) break;
    uVar15 = local_a8 + 1;
    uVar25 = local_a0 + local_a8 + 1 & sVar22;
    local_b0 = lVar23;
    local_a8 = uVar26;
    local_a0 = uVar9;
  } while (uVar15 <= sVar22);
  ppVar27 = (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *
            )0x0;
  local_b0 = lVar23;
  local_a8 = uVar26;
  local_a0 = uVar9;
LAB_00147c6a:
  pbVar11 = local_70;
  ppVar21 = ppVar27;
  if (ppVar27 ==
      (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *)0x0)
  {
    if ((this->packageMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
        .size_ctrl.size <
        (this->packageMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
                ((locator *)&res,local_b8,(arrays_type *)local_b8,local_80,local_c0,&local_e1,
                 local_70,&local_d8);
      psVar1 = &(this->packageMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar21 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
                ((locator *)&res,local_b8,local_c0,&local_e1,local_70,&local_d8);
      ppVar21 = res.p;
    }
  }
  pPVar17 = local_68;
  if (((ppVar27 !=
        (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *)0x0
       ) && (pbVar11->_M_len != 0)) && (local_d0->thisSym->kind == CompilationUnit)) {
    this_00 = Scope::addDiag(local_d0,(DiagCode)0x2a000a,(local_68->super_Symbol).location);
    Diagnostic::operator<<(this_00,(pPVar17->super_Symbol).name);
    Diagnostic::addNote(this_00,(DiagCode)0xa0001,
                        (((ppVar21->second).defaultNetType)->super_Symbol).location);
  }
  uVar8 = *(undefined8 *)&pPVar17->timeScale;
  sourceRange = parsing::Token::range(&((syntax->header).ptr)->name);
  checkElemTimeScale(this,(_Optional_base<slang::TimeScale,_true,_true>)SUB85(uVar8,0),sourceRange);
  return pPVar17;
}

Assistant:

const PackageSymbol& Compilation::createPackage(const Scope& scope,
                                                const ModuleDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto& metadata = syntaxMetadata[&syntax];
    if (!metadata.defaultNetType)
        metadata.defaultNetType = &scope.getDefaultNetType();

    auto& package = PackageSymbol::fromSyntax(scope, syntax, *metadata.defaultNetType,
                                              metadata.timeScale);

    auto [it, inserted] = packageMap.emplace(package.name, &package);
    if (!inserted && !package.name.empty() &&
        scope.asSymbol().kind == SymbolKind::CompilationUnit) {
        auto& diag = scope.addDiag(diag::Redefinition, package.location);
        diag << package.name;
        diag.addNote(diag::NotePreviousDefinition, it->second->location);
    }

    checkElemTimeScale(package.timeScale, syntax.header->name.range());

    return package;
}